

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O1

int __thiscall xray_re::_lzhuf::GetByte(_lzhuf *this)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  
  bVar2 = this->getlen;
  if (bVar2 < 9) {
    uVar3 = this->getbuf;
    iVar1 = 8 - (uint)bVar2;
    sVar4 = this->m_src_pos;
    do {
      uVar6 = 0xffffffff;
      sVar5 = sVar4;
      if (sVar4 < this->m_src_limit) {
        sVar5 = sVar4 + 1;
        this->m_src_pos = sVar5;
        uVar6 = (uint)this->m_src[sVar4];
      }
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      uVar3 = uVar3 | uVar6 << ((byte)iVar1 & 0x1f);
      this->getbuf = uVar3;
      bVar2 = bVar2 + 8;
      this->getlen = bVar2;
      iVar1 = iVar1 + -8;
      sVar4 = sVar5;
    } while (iVar1 == 0);
  }
  uVar3 = this->getbuf;
  this->getbuf = uVar3 << 8;
  this->getlen = bVar2 - 8;
  return uVar3 >> 8 & 0xff;
}

Assistant:

int _lzhuf::GetByte(void)	/* get one byte */
{
	unsigned i;

	while (getlen <= 8) {
		int c = getc();
		i = (c < 0) ? 0 : c;
		getbuf |= i << (8 - getlen);
		getlen += 8;
	}
	i = getbuf;
	getbuf <<= 8;
	getlen -= 8;
	return (i & 0xff00) >> 8;
}